

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c633::ktxTexture2_CreateCopyTest_CreateCopy_Test::TestBody
          (ktxTexture2_CreateCopyTest_CreateCopy_Test *this)

{
  bool bVar1;
  Message *pMVar2;
  long in_RDI;
  AssertionResult gtest_ar_5;
  ktx_size_t privateSize;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ktx_error_code_e result;
  ktxTexture2 *copyTexture;
  ktxTexture2 *texture;
  char (*in_stack_fffffffffffffdc8) [37];
  ktxTexture2 *in_stack_fffffffffffffdd0;
  ktxTexture2TestBase<unsigned_char,_4U,_32856U> *in_stack_fffffffffffffdd8;
  char *in_stack_fffffffffffffde0;
  Message *in_stack_fffffffffffffde8;
  int line;
  char *in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffdf8;
  Type type;
  AssertHelper *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  AssertionResult *in_stack_fffffffffffffe48;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffe50;
  AssertionResult local_188 [2];
  undefined4 local_168;
  int local_164;
  AssertionResult local_160 [2];
  undefined1 local_13a;
  undefined1 local_139;
  AssertionResult local_138;
  string local_128 [40];
  char *local_100;
  undefined1 local_e9;
  AssertionResult local_e8 [2];
  undefined4 local_c4;
  AssertionResult local_c0;
  uint local_ac;
  string local_a8 [40];
  undefined8 local_80;
  undefined1 local_69;
  AssertionResult local_68 [3];
  undefined4 local_34;
  AssertionResult local_30;
  undefined4 local_1c;
  long local_18;
  long local_10 [2];
  
  type = (Type)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  local_10[0] = 0;
  local_18 = 0;
  if (*(long *)(in_RDI + 0x1a0) != 0) {
    local_1c = ktxTexture_CreateFromMemory
                         (*(undefined8 *)(in_RDI + 0x1a0),*(undefined8 *)(in_RDI + 0x1a8),0,local_10
                         );
    local_34 = 0;
    testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
              ((char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
               (ktx_error_code_e *)in_stack_fffffffffffffdd8,&in_stack_fffffffffffffdd0->classId);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_30);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe00);
      testing::AssertionResult::failure_message((AssertionResult *)0x13e5c5);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe00,type,in_stack_fffffffffffffdf0,
                 (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),in_stack_fffffffffffffde0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffe50._M_head_impl,
                 (Message *)in_stack_fffffffffffffe48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdd0);
      testing::Message::~Message((Message *)0x13e622);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x13e690);
    local_69 = local_10[0] != 0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffdd0,(bool *)in_stack_fffffffffffffdc8,
               (type *)0x13e6be);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_68);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe00);
      testing::Message::operator<<((Message *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      local_80 = ktxErrorString(local_1c);
      testing::Message::operator<<
                ((Message *)in_stack_fffffffffffffdd0,(char **)in_stack_fffffffffffffdc8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffe48,
                 (char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                 in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe00,type,in_stack_fffffffffffffdf0,
                 (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),in_stack_fffffffffffffde0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffe50._M_head_impl,
                 (Message *)in_stack_fffffffffffffe48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdd0);
      std::__cxx11::string::~string(local_a8);
      testing::Message::~Message((Message *)0x13e7e2);
    }
    local_ac = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x13e88f);
    if (local_ac == 0) {
      local_1c = ktxTexture2_CreateCopy(local_10[0],&local_18);
      local_c4 = 0;
      testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
                ((char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                 (ktx_error_code_e *)in_stack_fffffffffffffdd8,&in_stack_fffffffffffffdd0->classId);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe00);
        in_stack_fffffffffffffe00 =
             (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x13e939);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe00,type,in_stack_fffffffffffffdf0,
                   (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),in_stack_fffffffffffffde0);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_fffffffffffffe50._M_head_impl,
                   (Message *)in_stack_fffffffffffffe48);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdd0);
        testing::Message::~Message((Message *)0x13e996);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13ea04);
      local_e9 = local_18 != 0;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)in_stack_fffffffffffffdd0,(bool *)in_stack_fffffffffffffdc8,
                 (type *)0x13ea32);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe00);
        pMVar2 = testing::Message::operator<<
                           ((Message *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
        type = (Type)((ulong)pMVar2 >> 0x20);
        in_stack_fffffffffffffdf0 = (char *)ktxErrorString(local_1c);
        local_100 = in_stack_fffffffffffffdf0;
        in_stack_fffffffffffffde8 =
             testing::Message::operator<<
                       ((Message *)in_stack_fffffffffffffdd0,(char **)in_stack_fffffffffffffdc8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (in_stack_fffffffffffffe48,
                   (char *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                   in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe00,type,in_stack_fffffffffffffdf0,
                   (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),in_stack_fffffffffffffde0);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_fffffffffffffe50._M_head_impl,
                   (Message *)in_stack_fffffffffffffe48);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdd0);
        std::__cxx11::string::~string(local_128);
        testing::Message::~Message((Message *)0x13eb56);
      }
      local_ac = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13ec03);
      if (local_ac == 0) {
        local_139 = ktxTexture2TestBase<unsigned_char,_4U,_32856U>::compareTexture
                              (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
        local_13a = 1;
        testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
                  ((char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                   (bool *)in_stack_fffffffffffffdd8,(bool *)in_stack_fffffffffffffdd0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_138);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe00);
          in_stack_fffffffffffffde0 =
               testing::AssertionResult::failure_message((AssertionResult *)0x13eca9);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffe00,type,in_stack_fffffffffffffdf0,
                     (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),in_stack_fffffffffffffde0);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)in_stack_fffffffffffffe50._M_head_impl,
                     (Message *)in_stack_fffffffffffffe48);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdd0);
          testing::Message::~Message((Message *)0x13ed06);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x13ed77);
        local_164 = memcmp(*(void **)(local_10[0] + 0x70),*(void **)(local_18 + 0x70),
                           *(size_t *)(local_10[0] + 0x68));
        local_168 = 0;
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                   (int *)in_stack_fffffffffffffdd8,(int *)in_stack_fffffffffffffdd0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_160);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe00);
          in_stack_fffffffffffffdd8 =
               (ktxTexture2TestBase<unsigned_char,_4U,_32856U> *)
               testing::AssertionResult::failure_message((AssertionResult *)0x13ee23);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffe00,type,in_stack_fffffffffffffdf0,
                     (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),in_stack_fffffffffffffde0);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)in_stack_fffffffffffffe50._M_head_impl,
                     (Message *)in_stack_fffffffffffffe48);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdd0);
          testing::Message::~Message((Message *)0x13ee80);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x13eef1);
        memcmp(*(void **)(local_10[0] + 0x18),*(void **)(local_18 + 0x18),0xa8);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                   (int *)in_stack_fffffffffffffdd8,(int *)in_stack_fffffffffffffdd0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_188);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe00);
          in_stack_fffffffffffffdd0 =
               (ktxTexture2 *)testing::AssertionResult::failure_message((AssertionResult *)0x13ef96)
          ;
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffe00,type,in_stack_fffffffffffffdf0,
                     (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),in_stack_fffffffffffffde0);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)in_stack_fffffffffffffe50._M_head_impl,
                     (Message *)in_stack_fffffffffffffe48);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdd0);
          testing::Message::~Message((Message *)0x13eff3);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x13f064);
        memcmp(*(void **)(local_10[0] + 0xa0),*(void **)(local_18 + 0xa0),
               (ulong)(*(int *)(local_10[0] + 0x34) - 1) * 0x18 + 0x38);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((char *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                   (int *)in_stack_fffffffffffffdd8,(int *)in_stack_fffffffffffffdd0);
        line = (int)((ulong)in_stack_fffffffffffffde8 >> 0x20);
        bVar1 = testing::AssertionResult::operator_cast_to_bool
                          ((AssertionResult *)&stack0xfffffffffffffe48);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe00);
          testing::AssertionResult::failure_message((AssertionResult *)0x13f123);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffe00,type,in_stack_fffffffffffffdf0,line,
                     in_stack_fffffffffffffde0);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)in_stack_fffffffffffffe50._M_head_impl,
                     (Message *)in_stack_fffffffffffffe48);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdd0);
          testing::Message::~Message((Message *)0x13f16f);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x13f1d4);
        if (local_10[0] != 0) {
          (*(code *)**(undefined8 **)(local_10[0] + 8))(local_10[0]);
        }
        if (local_18 != 0) {
          (*(code *)**(undefined8 **)(local_18 + 8))(local_18);
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(ktxTexture2_CreateCopyTest, CreateCopy) {
    ktxTexture2* texture = 0;
    ktxTexture2* copyTexture = 0;
    KTX_error_code result;

    if (ktxMemFile != NULL) {
        result = ktxTexture_CreateFromMemory(ktxMemFile, ktxMemFileLen,
                                             0,
                                             (ktxTexture**)&texture);
        EXPECT_EQ(result, KTX_SUCCESS);
        ASSERT_TRUE(texture != NULL) << "ktxTexture_CreateFromMemory failed: "
                                     << ktxErrorString(result);
        result = ktxTexture2_CreateCopy(texture, &copyTexture);
        EXPECT_EQ(result, KTX_SUCCESS);
        ASSERT_TRUE(copyTexture != NULL) << "ktxTexture_CreateFromMemory failed: "
                                     << ktxErrorString(result);

        EXPECT_EQ(compareTexture(copyTexture), true);
        EXPECT_EQ(memcmp(texture->pData, copyTexture->pData, texture->dataSize),
                  0);
        EXPECT_EQ(memcmp(texture->_protected, copyTexture->_protected,
                         sizeof(ktxTexture_protected)), 0);
        ktx_size_t privateSize = sizeof(ktxTexture2_private)
                               + sizeof(ktxLevelIndexEntry)
                               * (texture->numLevels - 1);
        EXPECT_EQ(memcmp(texture->_private, copyTexture->_private,
                         privateSize), 0);

        if (texture)
            ktxTexture_Destroy((ktxTexture*)texture);
        if (copyTexture)
            ktxTexture_Destroy((ktxTexture*)copyTexture);
    }
}